

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

void automatic_intra_tools_off(AV1_COMP *cpi,double sum_rec_distortion,double sum_est_rate)

{
  double estimate_bpp;
  double dist_per_pix;
  int qindex;
  AV1_COMMON *cm;
  double high_quality_dist_per_pix;
  double high_quality_bpp;
  int high_quality_qindex;
  double sum_est_rate_local;
  double sum_rec_distortion_local;
  AV1_COMP *cpi_local;
  
  if (((cpi->oxcf).intra_mode_cfg.auto_intra_tools_off & 1U) != 0) {
    if ((((cpi->common).quant_params.base_qindex < 0x80) &&
        (2.0 < sum_est_rate / (double)((cpi->common).width * (cpi->common).height * 100))) &&
       (sum_rec_distortion / (double)((cpi->common).width * (cpi->common).height) < 4.0)) {
      (cpi->oxcf).intra_mode_cfg.enable_smooth_intra = false;
      (cpi->oxcf).intra_mode_cfg.enable_paeth_intra = false;
      (cpi->oxcf).intra_mode_cfg.enable_cfl_intra = false;
      (cpi->oxcf).intra_mode_cfg.enable_diagonal_intra = false;
    }
  }
  return;
}

Assistant:

static void automatic_intra_tools_off(AV1_COMP *cpi,
                                      const double sum_rec_distortion,
                                      const double sum_est_rate) {
  if (!cpi->oxcf.intra_mode_cfg.auto_intra_tools_off) return;

  // Thresholds
  const int high_quality_qindex = 128;
  const double high_quality_bpp = 2.0;
  const double high_quality_dist_per_pix = 4.0;

  AV1_COMMON *const cm = &cpi->common;
  const int qindex = cm->quant_params.base_qindex;
  const double dist_per_pix =
      (double)sum_rec_distortion / (cm->width * cm->height);
  // The estimate bpp is not accurate, an empirical constant 100 is divided.
  const double estimate_bpp = sum_est_rate / (cm->width * cm->height * 100);

  if (qindex < high_quality_qindex && estimate_bpp > high_quality_bpp &&
      dist_per_pix < high_quality_dist_per_pix) {
    cpi->oxcf.intra_mode_cfg.enable_smooth_intra = 0;
    cpi->oxcf.intra_mode_cfg.enable_paeth_intra = 0;
    cpi->oxcf.intra_mode_cfg.enable_cfl_intra = 0;
    cpi->oxcf.intra_mode_cfg.enable_diagonal_intra = 0;
  }
}